

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O1

int ilu_dQuerySpace(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar2 = sp_ienv(1);
  lVar3 = (long)L->ncol;
  fVar4 = (float)L->ncol;
  pvVar1 = U->Store;
  fVar6 = (float)iVar2;
  fVar5 = (float)*(int *)(*(long *)((long)L->Store + 0x20) + lVar3 * 4) * 4.0 +
          (fVar4 * 4.0 + 3.0) * 4.0 +
          (float)*(int *)(*(long *)((long)L->Store + 0x10) + lVar3 * 4) * 8.0;
  mem_usage->for_lu = fVar5;
  fVar5 = (fVar4 + 1.0) * 4.0 + (float)*(int *)(*(long *)((long)pvVar1 + 0x18) + lVar3 * 4) * 12.0 +
          fVar5;
  mem_usage->for_lu = fVar5;
  mem_usage->total_needed =
       (fVar6 + fVar6 + 9.0 + 3.0) * fVar4 * 4.0 + (fVar6 + 1.0) * fVar4 * 8.0 + fVar5;
  return 0;
}

Assistant:

int ilu_dQuerySpace(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage)
{
    SCformat *Lstore;
    NCformat *Ustore;
    register int n, panel_size = sp_ienv(1);
    register float iword, dword;

    Lstore = L->Store;
    Ustore = U->Store;
    n = L->ncol;
    iword = sizeof(int);
    dword = sizeof(double);

    /* For LU factors */
    mem_usage->for_lu = (float)( (4.0f * n + 3.0f) * iword +
				 Lstore->nzval_colptr[n] * dword +
				 Lstore->rowind_colptr[n] * iword );
    mem_usage->for_lu += (float)( (n + 1.0f) * iword +
				 Ustore->colptr[n] * (dword + iword) );

    /* Working storage to support factorization.
       ILU needs 5*n more integers than LU */
    mem_usage->total_needed = mem_usage->for_lu +
	(float)( (2.0f * panel_size + 9.0f + NO_MARKER) * n * iword +
		(panel_size + 1.0f) * n * dword );

    return 0;
}